

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FileOptions *pFVar3;
  string_view element_name;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *service_local;
  DescriptorBuilder *this_local;
  
  pFVar2 = ServiceDescriptor::file(service);
  bVar1 = IsLite(pFVar2);
  if (bVar1) {
    pFVar2 = ServiceDescriptor::file(service);
    pFVar3 = FileDescriptor::options(pFVar2);
    bVar1 = FileOptions::cc_generic_services(pFVar3);
    if (!bVar1) {
      pFVar2 = ServiceDescriptor::file(service);
      pFVar3 = FileDescriptor::options(pFVar2);
      bVar1 = FileOptions::java_generic_services(pFVar3);
      if (!bVar1) {
        return;
      }
    }
    element_name = ServiceDescriptor::full_name(service);
    AddError(this,element_name,&proto->super_Message,NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_services to false."
            );
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const ServiceDescriptor* service,
                                        const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_services to false.");
  }
}